

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optTyped_swapEmptyWithEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>::
optTyped_swapEmptyWithEmpty_Test
          (optTyped_swapEmptyWithEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
           *this)

{
  optTyped_swapEmptyWithEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
  *this_local;
  
  anon_unknown.dwarf_dc07::optTyped<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>::optTyped
            (&this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>);
  (this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).super_Test.
  _vptr_Test = (_func_int **)&PTR__optTyped_swapEmptyWithEmpty_Test_00262e08;
  return;
}

Assistant:

TYPED_TEST(optTyped, swapEmptyWithEmpty)
{
  using opt_type = typename TestFixture::type;
  opt_type o1;
  opt_type o2;
  std::swap(o1, o2);
  EXPECT_FALSE(o1);
  EXPECT_FALSE(o1.has_value());
  EXPECT_THROW(o1.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o1.value_or(this->value_2));
  EXPECT_FALSE(o2);
  EXPECT_FALSE(o2.has_value());
  EXPECT_THROW(o2.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o2.value_or(this->value_2));
}